

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCamera.cpp
# Opt level: O1

void __thiscall chrono::ChCamera::ArchiveOUT(ChCamera *this,ChArchiveOut *archive)

{
  ChNameValue<chrono::ChVector<double>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChCamera>(archive);
  local_38._value = &this->position;
  local_38._name = "position";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(archive,&local_38);
  local_38._value = &this->aimpoint;
  local_38._name = "aimpoint";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(archive,&local_38);
  local_38._value = &this->upvector;
  local_38._name = "upvector";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(archive,&local_38);
  local_38._value = (ChVector<double> *)&this->angle;
  local_38._name = "angle";
  local_38._flags = '\0';
  (*(archive->super_ChArchive)._vptr_ChArchive[4])(archive,&local_38);
  local_38._value = (ChVector<double> *)&this->fov;
  local_38._name = "fov";
  local_38._flags = '\0';
  (*(archive->super_ChArchive)._vptr_ChArchive[4])(archive,&local_38);
  local_38._value = (ChVector<double> *)&this->hvratio;
  local_38._name = "hvratio";
  local_38._flags = '\0';
  (*(archive->super_ChArchive)._vptr_ChArchive[4])(archive,&local_38);
  local_38._value = (ChVector<double> *)&this->isometric;
  local_38._name = "isometric";
  local_38._flags = '\0';
  (*(archive->super_ChArchive)._vptr_ChArchive[2])(archive,&local_38);
  return;
}

Assistant:

void ChCamera::ArchiveOUT(ChArchiveOut& archive) {
    // version number
    archive.VersionWrite<ChCamera>();
    // serialize all member data:
    archive << CHNVP(position);
    archive << CHNVP(aimpoint);
    archive << CHNVP(upvector);
    archive << CHNVP(angle);
    archive << CHNVP(fov);
    archive << CHNVP(hvratio);
    archive << CHNVP(isometric);
}